

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_redistribution.cpp
# Opt level: O2

void Redistribution::Apply
               (Box *bx,int ncomp,Array4<double> *dUdt_out,Array4<double> *dUdt_in,
               Array4<const_double> *U_in,Array4<double> *scratch,
               Array4<const_amrex::EBCellFlag> *flag,Array4<const_double> *apx,
               Array4<const_double> *apy,Array4<const_double> *apz,Array4<const_double> *vfrac,
               Array4<const_double> *fcx,Array4<const_double> *fcy,Array4<const_double> *fcz,
               Array4<const_double> *ccc,BCRec *d_bcrec_ptr,Geometry *lev_geom,Real dt,
               string redistribution_type,int srd_max_order,Real target_volfrac,
               Array4<const_double> *srd_update_scale)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  long lVar8;
  long lVar9;
  undefined4 uVar13;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  bool bVar19;
  int k_1;
  long lVar20;
  double *pdVar21;
  long lVar22;
  double *pdVar23;
  long lVar24;
  double *pdVar25;
  double *pdVar26;
  double *pdVar27;
  long lVar28;
  int j_1;
  int iVar29;
  long lVar30;
  double *pdVar31;
  int iVar32;
  long lVar33;
  double *pdVar34;
  double *pdVar35;
  long lVar36;
  ulong uVar37;
  double *pdVar38;
  long lVar39;
  long lVar40;
  int j_2;
  ulong uVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  double *pdVar45;
  int j;
  int iVar46;
  void *__s;
  long lVar47;
  long lVar48;
  long lVar49;
  int iVar50;
  int k;
  int iVar51;
  long lVar52;
  long lVar53;
  double *pdVar54;
  double dVar55;
  long local_718;
  Box result;
  Box domain_per_grown;
  IntVect local_5c4;
  Array4<int> local_5b8;
  Box result_1;
  Array4<double> local_508;
  Array4<const_double> local_4c8;
  Array4<double> local_488;
  Array4<const_double> local_448;
  Array4<double> local_408;
  Array4<const_double> local_3c8;
  Array4<double> local_388;
  Array4<const_double> local_348;
  Array4<const_int> local_308;
  undefined1 local_2c8 [28];
  undefined4 uStack_2ac;
  double *local_2a8;
  int iStack_2a0;
  int iStack_29c;
  int iStack_298;
  int iStack_294;
  Long LStack_290;
  undefined8 local_288;
  int iStack_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined8 uStack_274;
  Elixir eli_chf;
  Elixir eli_nbf;
  Elixir eli_alpha;
  Elixir eli_nrs;
  Elixir eli_itr;
  Box result_2;
  IArrayBox itracker;
  FArrayBox cent_hat_fab;
  FArrayBox nbhd_vol_fab;
  FArrayBox alpha_fab;
  FArrayBox nrs_fab;
  Box result_3;
  
  iVar1 = (dUdt_out->begin).y;
  iVar2 = (bx->smallend).vect[0];
  local_718 = (long)iVar2;
  iVar3 = (bx->smallend).vect[1];
  iVar4 = (bx->bigend).vect[0];
  uVar41 = 0;
  uVar37 = 0;
  if (0 < ncomp) {
    uVar37 = (ulong)(uint)ncomp;
  }
  iVar5 = (dUdt_out->begin).x;
  lVar30 = dUdt_out->jstride * 8;
  iVar6 = (bx->smallend).vect[2];
  iVar50 = (dUdt_out->begin).z;
  pdVar23 = dUdt_out->p;
  lVar8 = dUdt_out->kstride;
  lVar9 = dUdt_out->nstride;
  iVar51 = (bx->bigend).vect[1];
  iVar29 = (bx->bigend).vect[2];
  for (; lVar22 = (long)iVar6, iVar32 = iVar6 - iVar50, uVar41 != uVar37; uVar41 = uVar41 + 1) {
    for (; lVar22 <= iVar29; lVar22 = lVar22 + 1) {
      __s = (void *)((long)pdVar23 +
                    (iVar32 * lVar8 + local_718) * 8 +
                    ((long)iVar3 - (long)iVar1) * lVar30 + (long)iVar5 * -8);
      for (iVar46 = iVar3; iVar46 <= iVar51; iVar46 = iVar46 + 1) {
        if (iVar2 <= iVar4) {
          memset(__s,0,(ulong)(uint)(iVar4 - iVar2) * 8 + 8);
        }
        __s = (void *)((long)__s + lVar30);
      }
      iVar32 = iVar32 + 1;
    }
    local_718 = local_718 + lVar9;
  }
  bVar19 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           redistribution_type._M_dataplus._M_p,"FluxRedist");
  if (bVar19) {
    local_2c8._0_8_ = dUdt_in->p;
    local_2c8._8_4_ = (undefined4)dUdt_in->jstride;
    local_2c8._12_4_ = (undefined4)((ulong)dUdt_in->jstride >> 0x20);
    local_2c8._16_4_ = (undefined4)dUdt_in->kstride;
    local_2c8._20_4_ = (undefined4)((ulong)dUdt_in->kstride >> 0x20);
    local_2c8._24_4_ = (undefined4)dUdt_in->nstride;
    uStack_2ac = (undefined4)((ulong)dUdt_in->nstride >> 0x20);
    iStack_2a0 = (dUdt_in->begin).z;
    local_2a8._0_4_ = (dUdt_in->begin).x;
    local_2a8._4_4_ = (dUdt_in->begin).y;
    uVar7 = (dUdt_in->end).x;
    uVar13 = (dUdt_in->end).y;
    iStack_294 = (dUdt_in->end).z;
    LStack_290 = CONCAT44(LStack_290._4_4_,dUdt_in->ncomp);
    itracker.super_BaseFab<int>._vptr_BaseFab = (_func_int **)scratch->p;
    itracker.super_BaseFab<int>.super_DataAllocator.m_arena = (Arena *)scratch->jstride;
    itracker.super_BaseFab<int>.dptr = (int *)scratch->kstride;
    itracker.super_BaseFab<int>.domain.smallend.vect._0_8_ = scratch->nstride;
    itracker.super_BaseFab<int>.domain.bigend.vect[1] = (scratch->begin).z;
    itracker.super_BaseFab<int>.domain.smallend.vect[2] = (scratch->begin).x;
    itracker.super_BaseFab<int>.domain.bigend.vect[0] = (scratch->begin).y;
    itracker.super_BaseFab<int>.domain.bigend.vect[2] = (scratch->end).x;
    itracker.super_BaseFab<int>.domain.btype.itype = (scratch->end).y;
    itracker.super_BaseFab<int>.nvar = (scratch->end).z;
    itracker.super_BaseFab<int>.truesize._0_4_ = scratch->ncomp;
    iStack_29c = uVar7;
    iStack_298 = uVar13;
    amrex::apply_flux_redistribution
              (bx,dUdt_out,(Array4<const_double> *)local_2c8,(Array4<const_double> *)&itracker,0,
               ncomp,flag,vfrac,lev_geom);
  }
  else {
    bVar19 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             redistribution_type._M_dataplus._M_p,"StateRedist");
    if (bVar19) {
      uVar14 = *(undefined8 *)(bx->smallend).vect;
      uVar15 = *(undefined8 *)((bx->smallend).vect + 2);
      uVar16 = *(undefined8 *)((bx->bigend).vect + 2);
      result.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
      result.bigend.vect[2] = (int)uVar16;
      result.btype.itype = (uint)((ulong)uVar16 >> 0x20);
      result.smallend.vect[2] = (int)uVar15;
      result.bigend.vect[0] = (int)((ulong)uVar15 >> 0x20);
      result.smallend.vect[0] = (int)uVar14;
      result.smallend.vect[1] = (int)((ulong)uVar14 >> 0x20);
      result.smallend.vect[0] = result.smallend.vect[0] + -1;
      result.smallend.vect[1] = result.smallend.vect[1] + -1;
      result.smallend.vect[2] = result.smallend.vect[2] + -1;
      result.bigend.vect[0] = result.bigend.vect[0] + 1;
      result.bigend.vect[1] = result.bigend.vect[1] + 1;
      result.bigend.vect[2] = result.bigend.vect[2] + 1;
      uVar14 = *(undefined8 *)(bx->smallend).vect;
      uVar15 = *(undefined8 *)((bx->smallend).vect + 2);
      uVar16 = *(undefined8 *)((bx->bigend).vect + 2);
      result_1.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
      result_1.bigend.vect[2] = (int)uVar16;
      result_1.btype.itype = (uint)((ulong)uVar16 >> 0x20);
      result_1.smallend.vect[2] = (int)uVar15;
      result_1.bigend.vect[0] = (int)((ulong)uVar15 >> 0x20);
      result_1.smallend.vect[0] = (int)uVar14;
      result_1.smallend.vect[1] = (int)((ulong)uVar14 >> 0x20);
      result_1.smallend.vect[2] = result_1.smallend.vect[2] + -2;
      result_1.bigend.vect[0] = result_1.bigend.vect[0] + 2;
      result_1.smallend.vect[1] = result_1.smallend.vect[1] + -2;
      result_1.smallend.vect[0] = result_1.smallend.vect[0] + -2;
      result_1.bigend.vect[1] = result_1.bigend.vect[1] + 2;
      result_1.bigend.vect[2] = result_1.bigend.vect[2] + 2;
      uVar14 = *(undefined8 *)(bx->smallend).vect;
      uVar15 = *(undefined8 *)((bx->smallend).vect + 2);
      uVar16 = *(undefined8 *)((bx->bigend).vect + 2);
      result_2.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
      result_2.bigend.vect[2] = (int)uVar16;
      result_2.btype.itype = (uint)((ulong)uVar16 >> 0x20);
      result_2.smallend.vect[2] = (int)uVar15;
      result_2.bigend.vect[0] = (int)((ulong)uVar15 >> 0x20);
      result_2.smallend.vect[0] = (int)uVar14;
      result_2.smallend.vect[1] = (int)((ulong)uVar14 >> 0x20);
      result_2.smallend.vect[2] = result_2.smallend.vect[2] + -3;
      result_2.bigend.vect[0] = result_2.bigend.vect[0] + 3;
      result_2.smallend.vect[1] = result_2.smallend.vect[1] + -3;
      result_2.smallend.vect[0] = result_2.smallend.vect[0] + -3;
      result_2.bigend.vect[1] = result_2.bigend.vect[1] + 3;
      result_2.bigend.vect[2] = result_2.bigend.vect[2] + 3;
      uVar14 = *(undefined8 *)(bx->smallend).vect;
      uVar15 = *(undefined8 *)((bx->smallend).vect + 2);
      uVar16 = *(undefined8 *)((bx->bigend).vect + 2);
      result_3.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
      result_3.bigend.vect[2] = (int)uVar16;
      result_3.btype.itype = (uint)((ulong)uVar16 >> 0x20);
      result_3.smallend.vect[2] = (int)uVar15;
      result_3.bigend.vect[0] = (int)((ulong)uVar15 >> 0x20);
      result_3.smallend.vect[0] = (int)uVar14;
      result_3.smallend.vect[1] = (int)((ulong)uVar14 >> 0x20);
      result_3.smallend.vect[2] = result_3.smallend.vect[2] + -4;
      result_3.bigend.vect[0] = result_3.bigend.vect[0] + 4;
      result_3.smallend.vect[1] = result_3.smallend.vect[1] + -4;
      result_3.smallend.vect[0] = result_3.smallend.vect[0] + -4;
      result_3.bigend.vect[1] = result_3.bigend.vect[1] + 4;
      result_3.bigend.vect[2] = result_3.bigend.vect[2] + 4;
      amrex::IArrayBox::IArrayBox(&itracker,&result_3,8,true,false,(Arena *)0x0);
      amrex::FArrayBox::FArrayBox(&nrs_fab,&result_2,1,true,false,(Arena *)0x0);
      amrex::FArrayBox::FArrayBox(&alpha_fab,&result_2,2,true,false,(Arena *)0x0);
      amrex::FArrayBox::FArrayBox(&nbhd_vol_fab,&result_1,1,true,false,(Arena *)0x0);
      amrex::FArrayBox::FArrayBox(&cent_hat_fab,&result_2,3,true,false,(Arena *)0x0);
      amrex::BaseFab<int>::elixir<int,_0>(&eli_itr,&itracker.super_BaseFab<int>);
      local_5b8.p = itracker.super_BaseFab<int>.dptr;
      local_5b8.jstride =
           ((long)itracker.super_BaseFab<int>.domain.bigend.vect[0] -
           (long)itracker.super_BaseFab<int>.domain.smallend.vect[0]) + 1;
      local_5b8.kstride =
           (((long)itracker.super_BaseFab<int>.domain.bigend.vect[1] + 1) -
           (long)itracker.super_BaseFab<int>.domain.smallend.vect[1]) * local_5b8.jstride;
      local_5b8.nstride =
           (((long)itracker.super_BaseFab<int>.domain.bigend.vect[2] + 1) -
           (long)itracker.super_BaseFab<int>.domain.smallend.vect[2]) * local_5b8.kstride;
      local_5b8.begin.x = itracker.super_BaseFab<int>.domain.smallend.vect[0];
      local_5b8.begin.y = itracker.super_BaseFab<int>.domain.smallend.vect[1];
      local_5b8.begin.z = itracker.super_BaseFab<int>.domain.smallend.vect[2];
      local_5b8.end._0_8_ =
           (long)itracker.super_BaseFab<int>.domain.bigend.vect[0] + 1U & 0xffffffff |
           (long)itracker.super_BaseFab<int>.domain.bigend.vect[1] + 1 << 0x20;
      local_5b8.end.z = (int)((long)itracker.super_BaseFab<int>.domain.bigend.vect[2] + 1);
      local_5b8.ncomp = itracker.super_BaseFab<int>.nvar;
      local_308.p = itracker.super_BaseFab<int>.dptr;
      local_308.begin.x = itracker.super_BaseFab<int>.domain.smallend.vect[0];
      local_308.begin.y = itracker.super_BaseFab<int>.domain.smallend.vect[1];
      local_308.begin.z = itracker.super_BaseFab<int>.domain.smallend.vect[2];
      local_308.ncomp = itracker.super_BaseFab<int>.nvar;
      local_308.jstride = local_5b8.jstride;
      local_308.kstride = local_5b8.kstride;
      local_308.nstride = local_5b8.nstride;
      local_308.end._0_8_ = local_5b8.end._0_8_;
      local_308.end.z = local_5b8.end.z;
      amrex::BaseFab<double>::elixir<double,_0>(&eli_nrs,&nrs_fab.super_BaseFab<double>);
      local_508.begin.y = nrs_fab.super_BaseFab<double>.domain.smallend.vect[1];
      local_508.begin.x = nrs_fab.super_BaseFab<double>.domain.smallend.vect[0];
      local_508.p = nrs_fab.super_BaseFab<double>.dptr;
      local_508.jstride =
           ((long)nrs_fab.super_BaseFab<double>.domain.bigend.vect[0] -
           (long)nrs_fab.super_BaseFab<double>.domain.smallend.vect[0]) + 1;
      local_508.kstride =
           (((long)nrs_fab.super_BaseFab<double>.domain.bigend.vect[1] + 1) -
           (long)nrs_fab.super_BaseFab<double>.domain.smallend.vect[1]) * local_508.jstride;
      local_508.nstride =
           (((long)nrs_fab.super_BaseFab<double>.domain.bigend.vect[2] + 1) -
           (long)nrs_fab.super_BaseFab<double>.domain.smallend.vect[2]) * local_508.kstride;
      local_508.begin.z = nrs_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_508.end._0_8_ =
           (long)nrs_fab.super_BaseFab<double>.domain.bigend.vect[0] + 1U & 0xffffffff |
           (long)nrs_fab.super_BaseFab<double>.domain.bigend.vect[1] + 1 << 0x20;
      local_508.end.z = (int)((long)nrs_fab.super_BaseFab<double>.domain.bigend.vect[2] + 1);
      local_508.ncomp = nrs_fab.super_BaseFab<double>.nvar;
      local_348.p = nrs_fab.super_BaseFab<double>.dptr;
      local_348.begin.z = nrs_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_348.ncomp = nrs_fab.super_BaseFab<double>.nvar;
      local_348.jstride = local_508.jstride;
      local_348.kstride = local_508.kstride;
      local_348.nstride = local_508.nstride;
      local_348.end._0_8_ = local_508.end._0_8_;
      local_348.end.z = local_508.end.z;
      amrex::BaseFab<double>::elixir<double,_0>(&eli_alpha,&alpha_fab.super_BaseFab<double>);
      local_388.p = alpha_fab.super_BaseFab<double>.dptr;
      local_3c8.jstride =
           ((long)alpha_fab.super_BaseFab<double>.domain.bigend.vect[0] -
           (long)alpha_fab.super_BaseFab<double>.domain.smallend.vect[0]) + 1;
      local_3c8.kstride =
           (((long)alpha_fab.super_BaseFab<double>.domain.bigend.vect[1] + 1) -
           (long)alpha_fab.super_BaseFab<double>.domain.smallend.vect[1]) * local_3c8.jstride;
      local_3c8.nstride =
           (((long)alpha_fab.super_BaseFab<double>.domain.bigend.vect[2] + 1) -
           (long)alpha_fab.super_BaseFab<double>.domain.smallend.vect[2]) * local_3c8.kstride;
      local_388.begin.z = alpha_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_3c8.end._0_8_ =
           (long)alpha_fab.super_BaseFab<double>.domain.bigend.vect[0] + 1U & 0xffffffff |
           (long)alpha_fab.super_BaseFab<double>.domain.bigend.vect[1] + 1 << 0x20;
      local_3c8.end.z = (int)((long)alpha_fab.super_BaseFab<double>.domain.bigend.vect[2] + 1);
      local_388.ncomp = alpha_fab.super_BaseFab<double>.nvar;
      local_3c8.p = alpha_fab.super_BaseFab<double>.dptr;
      local_3c8.begin.z = alpha_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_3c8.ncomp = alpha_fab.super_BaseFab<double>.nvar;
      local_388.jstride = local_3c8.jstride;
      local_388.kstride = local_3c8.kstride;
      local_388.nstride = local_3c8.nstride;
      local_388.end._0_8_ = local_3c8.end._0_8_;
      local_388.end.z = local_3c8.end.z;
      amrex::BaseFab<double>::elixir<double,_0>(&eli_nbf,&nbhd_vol_fab.super_BaseFab<double>);
      local_408.p = nbhd_vol_fab.super_BaseFab<double>.dptr;
      local_448.jstride =
           ((long)nbhd_vol_fab.super_BaseFab<double>.domain.bigend.vect[0] -
           (long)nbhd_vol_fab.super_BaseFab<double>.domain.smallend.vect[0]) + 1;
      local_448.kstride =
           (((long)nbhd_vol_fab.super_BaseFab<double>.domain.bigend.vect[1] + 1) -
           (long)nbhd_vol_fab.super_BaseFab<double>.domain.smallend.vect[1]) * local_448.jstride;
      local_448.nstride =
           (((long)nbhd_vol_fab.super_BaseFab<double>.domain.bigend.vect[2] + 1) -
           (long)nbhd_vol_fab.super_BaseFab<double>.domain.smallend.vect[2]) * local_448.kstride;
      local_408.begin.z = nbhd_vol_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_448.end._0_8_ =
           (long)nbhd_vol_fab.super_BaseFab<double>.domain.bigend.vect[0] + 1U & 0xffffffff |
           (long)nbhd_vol_fab.super_BaseFab<double>.domain.bigend.vect[1] + 1 << 0x20;
      local_448.end.z = (int)((long)nbhd_vol_fab.super_BaseFab<double>.domain.bigend.vect[2] + 1);
      local_408.ncomp = nbhd_vol_fab.super_BaseFab<double>.nvar;
      local_448.p = nbhd_vol_fab.super_BaseFab<double>.dptr;
      local_448.begin.z = nbhd_vol_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_448.ncomp = nbhd_vol_fab.super_BaseFab<double>.nvar;
      local_408.jstride = local_448.jstride;
      local_408.kstride = local_448.kstride;
      local_408.nstride = local_448.nstride;
      local_408.end._0_8_ = local_448.end._0_8_;
      local_408.end.z = local_448.end.z;
      amrex::BaseFab<double>::elixir<double,_0>(&eli_chf,&cent_hat_fab.super_BaseFab<double>);
      local_488.p = cent_hat_fab.super_BaseFab<double>.dptr;
      local_4c8.jstride =
           ((long)cent_hat_fab.super_BaseFab<double>.domain.bigend.vect[0] -
           (long)cent_hat_fab.super_BaseFab<double>.domain.smallend.vect[0]) + 1;
      local_4c8.kstride =
           (((long)cent_hat_fab.super_BaseFab<double>.domain.bigend.vect[1] + 1) -
           (long)cent_hat_fab.super_BaseFab<double>.domain.smallend.vect[1]) * local_4c8.jstride;
      local_4c8.nstride =
           (((long)cent_hat_fab.super_BaseFab<double>.domain.bigend.vect[2] + 1) -
           (long)cent_hat_fab.super_BaseFab<double>.domain.smallend.vect[2]) * local_4c8.kstride;
      local_488.begin.z = cent_hat_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_4c8.end._0_8_ =
           (long)cent_hat_fab.super_BaseFab<double>.domain.bigend.vect[0] + 1U & 0xffffffff |
           (long)cent_hat_fab.super_BaseFab<double>.domain.bigend.vect[1] + 1 << 0x20;
      local_4c8.end.z = (int)((long)cent_hat_fab.super_BaseFab<double>.domain.bigend.vect[2] + 1);
      local_488.ncomp = cent_hat_fab.super_BaseFab<double>.nvar;
      local_4c8.p = cent_hat_fab.super_BaseFab<double>.dptr;
      local_4c8.begin.z = cent_hat_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_4c8.ncomp = cent_hat_fab.super_BaseFab<double>.nvar;
      domain_per_grown.smallend.vect._0_8_ = *(undefined8 *)(lev_geom->domain).smallend.vect;
      uVar14 = *(undefined8 *)((lev_geom->domain).smallend.vect + 2);
      domain_per_grown._20_8_ = *(undefined8 *)((lev_geom->domain).bigend.vect + 2);
      domain_per_grown.bigend.vect[1] =
           (int)((ulong)*(undefined8 *)(lev_geom->domain).bigend.vect >> 0x20);
      domain_per_grown.smallend.vect[2] = (int)uVar14;
      domain_per_grown.bigend.vect[0] = (int)((ulong)uVar14 >> 0x20);
      if ((lev_geom->super_CoordSys).field_0x51 == '\x01') {
        domain_per_grown.smallend.vect[0] = domain_per_grown.smallend.vect[0] + -1;
        domain_per_grown.bigend.vect[0] = domain_per_grown.bigend.vect[0] + 1;
      }
      if ((lev_geom->super_CoordSys).field_0x52 == '\x01') {
        domain_per_grown.smallend.vect[1] = domain_per_grown.smallend.vect[1] + -1;
        domain_per_grown.bigend.vect[1] = domain_per_grown.bigend.vect[1] + 1;
      }
      if ((lev_geom->super_CoordSys).field_0x53 == '\x01') {
        domain_per_grown.smallend.vect[2] = domain_per_grown.smallend.vect[2] + -1;
        domain_per_grown.bigend.vect[2] = domain_per_grown.bigend.vect[2] + 1;
      }
      local_488.jstride = local_4c8.jstride;
      local_488.kstride = local_4c8.kstride;
      local_488.nstride = local_4c8.nstride;
      local_488.end._0_8_ = local_4c8.end._0_8_;
      local_488.end.z = local_4c8.end.z;
      bVar19 = amrex::Box::contains(&domain_per_grown,&result);
      iVar6 = result.bigend.vect[2];
      iVar5 = result.bigend.vect[1];
      iVar4 = result.bigend.vect[0];
      iVar3 = result.smallend.vect[2];
      iVar2 = result.smallend.vect[1];
      iVar1 = result.smallend.vect[0];
      if (!bVar19) {
        local_2c8._16_4_ = domain_per_grown.bigend.vect[1];
        local_2c8._20_4_ = domain_per_grown.bigend.vect[2];
        local_2c8._24_4_ = domain_per_grown.btype.itype;
        local_2c8._0_4_ = domain_per_grown.smallend.vect[0];
        local_2c8._4_4_ = domain_per_grown.smallend.vect[1];
        local_2c8._8_4_ = domain_per_grown.smallend.vect[2];
        local_2c8._12_4_ = domain_per_grown.bigend.vect[0];
        local_2a8 = dUdt_in->p;
        LStack_290 = dUdt_in->nstride;
        local_288._0_4_ = (dUdt_in->begin).x;
        local_288._4_4_ = (dUdt_in->begin).y;
        uVar17 = (dUdt_in->end).x;
        uVar18 = (dUdt_in->end).y;
        uStack_274 = *(undefined8 *)&(dUdt_in->end).z;
        iStack_2a0 = (int)dUdt_in->jstride;
        iStack_29c = (int)((ulong)dUdt_in->jstride >> 0x20);
        iStack_298 = (int)dUdt_in->kstride;
        iStack_294 = (int)((ulong)dUdt_in->kstride >> 0x20);
        iStack_280 = (int)*(undefined8 *)&(dUdt_in->begin).z;
        iVar50 = result.bigend.vect[0] + 1;
        uStack_27c = uVar17;
        uStack_278 = uVar18;
        for (uVar41 = 0; iVar51 = iVar3, uVar41 != uVar37; uVar41 = uVar41 + 1) {
          for (; iVar29 = iVar2, iVar51 <= iVar6; iVar51 = iVar51 + 1) {
            for (; iVar29 <= iVar5; iVar29 = iVar29 + 1) {
              iVar32 = iVar1;
              if (iVar1 <= iVar4) {
                do {
                  local_5c4.vect[0] = iVar32;
                  local_5c4.vect[1] = iVar29;
                  local_5c4.vect[2] = iVar51;
                  bVar19 = amrex::Box::contains((Box *)local_2c8,&local_5c4);
                  if (!bVar19) {
                    local_2a8[((long)iVar29 - (long)local_288._4_4_) *
                              CONCAT44(iStack_29c,iStack_2a0) +
                              (long)(iVar32 - (int)local_288) +
                              ((long)iVar51 - (long)iStack_280) * CONCAT44(iStack_294,iStack_298) +
                              LStack_290 * uVar41] = 0.0;
                  }
                  iVar32 = iVar32 + 1;
                } while (iVar50 != iVar32);
              }
            }
          }
        }
      }
      amrex::Box::Box<double>((Box *)local_2c8,scratch);
      iVar1 = *(int *)(redistribution_type.field_2._M_allocated_capacity + 0x28);
      lVar8 = scratch->jstride;
      lVar9 = scratch->kstride;
      lVar30 = U_in->jstride;
      lVar22 = dUdt_in->jstride;
      lVar33 = (long)(int)local_2c8._4_4_;
      lVar52 = (long)(int)local_2c8._8_4_;
      lVar39 = (long)(int)local_2c8._0_4_;
      lVar10 = dUdt_in->kstride;
      lVar11 = U_in->kstride;
      iVar2 = *(int *)(redistribution_type.field_2._M_allocated_capacity + 0x24);
      lVar48 = *(long *)(redistribution_type.field_2._M_allocated_capacity + 0x10);
      lVar53 = *(long *)(redistribution_type.field_2._M_allocated_capacity + 8);
      iVar3 = *(int *)(redistribution_type.field_2._M_allocated_capacity + 0x20);
      pdVar27 = scratch->p +
                ((lVar39 + (lVar52 - (scratch->begin).z) * lVar9 +
                           (lVar33 - (scratch->begin).y) * lVar8) - (long)(scratch->begin).x);
      lVar43 = scratch->nstride;
      pdVar23 = dUdt_in->p +
                ((lVar39 + (lVar52 - (dUdt_in->begin).z) * lVar10 +
                           (lVar33 - (dUdt_in->begin).y) * lVar22) - (long)(dUdt_in->begin).x);
      lVar40 = dUdt_in->nstride;
      pdVar38 = U_in->p + ((lVar39 + (lVar52 - (U_in->begin).z) * lVar11 +
                                     (lVar33 - (U_in->begin).y) * lVar30) - (long)(U_in->begin).x);
      lVar36 = U_in->nstride;
      lVar12 = *(long *)redistribution_type.field_2._M_allocated_capacity;
      for (uVar41 = 0; lVar20 = lVar52,
          lVar28 = (lVar33 - iVar2) * lVar53 * 8 + (lVar52 - iVar1) * lVar48 * 8 + lVar39 * 8 +
                   (long)iVar3 * -8 + lVar12, pdVar25 = pdVar38, pdVar31 = pdVar23,
          pdVar45 = pdVar27, uVar41 != uVar37; uVar41 = uVar41 + 1) {
        for (; lVar24 = lVar28, pdVar35 = pdVar25, lVar42 = lVar33, pdVar21 = pdVar31,
            pdVar26 = pdVar45, lVar20 <= (int)local_2c8._20_4_; lVar20 = lVar20 + 1) {
          for (; lVar42 <= (int)local_2c8._16_4_; lVar42 = lVar42 + 1) {
            if ((int)local_2c8._0_4_ <= (int)local_2c8._12_4_) {
              lVar47 = 0;
              do {
                dVar55 = 1.0;
                if (lVar12 != 0) {
                  dVar55 = *(double *)(lVar24 + lVar47 * 8);
                }
                pdVar26[lVar47] = (pdVar21[lVar47] * dt) / dVar55 + pdVar35[lVar47];
                lVar47 = lVar47 + 1;
              } while ((local_2c8._12_4_ - local_2c8._0_4_) + 1 != (int)lVar47);
            }
            pdVar26 = pdVar26 + lVar8;
            pdVar21 = pdVar21 + lVar22;
            pdVar35 = pdVar35 + lVar30;
            lVar24 = lVar24 + lVar53 * 8;
          }
          lVar28 = lVar28 + lVar48 * 8;
          pdVar25 = pdVar25 + lVar11;
          pdVar31 = pdVar31 + lVar10;
          pdVar45 = pdVar45 + lVar9;
        }
        pdVar27 = pdVar27 + lVar43;
        pdVar23 = pdVar23 + lVar40;
        pdVar38 = pdVar38 + lVar36;
      }
      MakeITracker(bx,apx,apy,apz,vfrac,&local_5b8,lev_geom,target_volfrac);
      local_2c8._0_8_ = local_5b8.p;
      local_2c8._8_4_ = (undefined4)local_5b8.jstride;
      local_2c8._12_4_ = (undefined4)((ulong)local_5b8.jstride >> 0x20);
      local_2c8._16_4_ = (undefined4)local_5b8.kstride;
      local_2c8._20_4_ = (undefined4)((ulong)local_5b8.kstride >> 0x20);
      local_2c8._24_4_ = (undefined4)local_5b8.nstride;
      uStack_2ac = (undefined4)((ulong)local_5b8.nstride >> 0x20);
      local_2a8 = (double *)local_5b8.begin._0_8_;
      iStack_2a0 = local_5b8.begin.z;
      iStack_29c = local_5b8.end.x;
      iStack_298 = local_5b8.end.y;
      iStack_294 = local_5b8.end.z;
      LStack_290 = CONCAT44(LStack_290._4_4_,local_5b8.ncomp);
      MakeStateRedistUtils
                (bx,flag,vfrac,ccc,(Array4<const_int> *)local_2c8,&local_508,&local_388,&local_408,
                 &local_488,lev_geom,target_volfrac);
      StateRedistribute(bx,ncomp,dUdt_out,scratch,flag,vfrac,fcx,fcy,fcz,ccc,d_bcrec_ptr,&local_308,
                        &local_348,&local_3c8,&local_448,&local_4c8,lev_geom,
                        (int)redistribution_type._M_string_length);
      lVar8 = dUdt_out->jstride;
      lVar9 = U_in->jstride;
      lVar30 = U_in->kstride;
      lVar52 = (long)(bx->smallend).vect[1];
      lVar39 = (long)(bx->smallend).vect[2];
      iVar1 = (bx->smallend).vect[0];
      lVar33 = (long)iVar1;
      lVar22 = dUdt_out->kstride;
      iVar2 = *(int *)(redistribution_type.field_2._M_allocated_capacity + 0x28);
      iVar3 = *(int *)(redistribution_type.field_2._M_allocated_capacity + 0x24);
      lVar10 = *(long *)(redistribution_type.field_2._M_allocated_capacity + 0x10);
      lVar11 = *(long *)(redistribution_type.field_2._M_allocated_capacity + 8);
      iVar4 = *(int *)(redistribution_type.field_2._M_allocated_capacity + 0x20);
      lVar48 = dUdt_in->kstride;
      lVar53 = dUdt_in->jstride;
      pdVar27 = dUdt_out->p +
                ((lVar33 + (lVar39 - (dUdt_out->begin).z) * lVar22 +
                           (lVar52 - (dUdt_out->begin).y) * lVar8) - (long)(dUdt_out->begin).x);
      lVar43 = *(long *)redistribution_type.field_2._M_allocated_capacity;
      lVar40 = dUdt_out->nstride;
      pdVar23 = U_in->p + ((lVar33 + (lVar39 - (U_in->begin).z) * lVar30 +
                                     (lVar52 - (U_in->begin).y) * lVar9) - (long)(U_in->begin).x);
      lVar36 = U_in->nstride;
      pdVar38 = dUdt_in->p +
                ((lVar33 + (lVar39 - (dUdt_in->begin).z) * lVar48 +
                           (lVar52 - (dUdt_in->begin).y) * lVar53) - (long)(dUdt_in->begin).x);
      lVar12 = dUdt_in->nstride;
      iVar5 = (bx->bigend).vect[0];
      iVar6 = (bx->bigend).vect[1];
      iVar50 = (bx->bigend).vect[2];
      for (uVar41 = 0;
          lVar20 = (lVar52 - local_5b8.begin.y) * local_5b8.jstride * 4 +
                   (lVar39 - local_5b8.begin.z) * local_5b8.kstride * 4 + lVar33 * 4 +
                   (long)local_5b8.begin.x * -4 + (long)local_5b8.p, pdVar25 = pdVar27,
          lVar28 = lVar39, pdVar31 = pdVar38,
          lVar24 = (lVar52 - iVar3) * lVar11 * 8 + (lVar39 - iVar2) * lVar10 * 8 + lVar33 * 8 +
                   (long)iVar4 * -8 + lVar43, pdVar45 = pdVar23,
          pdVar35 = local_508.p +
                    ((lVar33 + (lVar39 - local_508.begin.z) * local_508.kstride +
                               (lVar52 - local_508.begin.y) * local_508.jstride) -
                    (long)local_508.begin.x), uVar41 != uVar37; uVar41 = uVar41 + 1) {
        for (; pdVar21 = pdVar25, pdVar26 = pdVar45, pdVar34 = pdVar31, lVar42 = lVar52,
            lVar47 = lVar24, lVar44 = lVar20, pdVar54 = pdVar35, lVar28 <= iVar50;
            lVar28 = lVar28 + 1) {
          for (; lVar42 <= iVar6; lVar42 = lVar42 + 1) {
            if (iVar1 <= iVar5) {
              lVar49 = 0;
              do {
                if ((0 < *(int *)(lVar44 + lVar49 * 4)) || (1.0 < pdVar54[lVar49])) {
                  dVar55 = 1.0;
                  if (lVar43 != 0) {
                    dVar55 = *(double *)(lVar47 + lVar49 * 8);
                  }
                  pdVar21[lVar49] = ((pdVar21[lVar49] - pdVar26[lVar49]) * dVar55) / dt;
                }
                else {
                  pdVar21[lVar49] = pdVar34[lVar49];
                }
                lVar49 = lVar49 + 1;
              } while ((iVar5 - iVar1) + 1 != (int)lVar49);
            }
            pdVar26 = pdVar26 + lVar9;
            pdVar21 = pdVar21 + lVar8;
            lVar47 = lVar47 + lVar11 * 8;
            pdVar34 = pdVar34 + lVar53;
            pdVar54 = pdVar54 + local_508.jstride;
            lVar44 = lVar44 + local_5b8.jstride * 4;
          }
          lVar20 = lVar20 + local_5b8.kstride * 4;
          pdVar25 = pdVar25 + lVar22;
          pdVar31 = pdVar31 + lVar48;
          lVar24 = lVar24 + lVar10 * 8;
          pdVar45 = pdVar45 + lVar30;
          pdVar35 = pdVar35 + local_508.kstride;
        }
        pdVar23 = pdVar23 + lVar36;
        pdVar27 = pdVar27 + lVar40;
        pdVar38 = pdVar38 + lVar12;
      }
      amrex::Gpu::Elixir::~Elixir(&eli_chf);
      amrex::Gpu::Elixir::~Elixir(&eli_nbf);
      amrex::Gpu::Elixir::~Elixir(&eli_alpha);
      amrex::Gpu::Elixir::~Elixir(&eli_nrs);
      amrex::Gpu::Elixir::~Elixir(&eli_itr);
      amrex::BaseFab<double>::~BaseFab(&cent_hat_fab.super_BaseFab<double>);
      amrex::BaseFab<double>::~BaseFab(&nbhd_vol_fab.super_BaseFab<double>);
      amrex::BaseFab<double>::~BaseFab(&alpha_fab.super_BaseFab<double>);
      amrex::BaseFab<double>::~BaseFab(&nrs_fab.super_BaseFab<double>);
      amrex::BaseFab<int>::~BaseFab(&itracker.super_BaseFab<int>);
    }
    else {
      bVar19 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               redistribution_type._M_dataplus._M_p,"NoRedist");
      if (!bVar19) {
        amrex::Error_host("Not a legit redist_type");
        return;
      }
      lVar8 = dUdt_out->jstride;
      lVar9 = dUdt_out->kstride;
      lVar30 = dUdt_out->nstride;
      lVar22 = dUdt_in->jstride;
      lVar10 = dUdt_in->kstride;
      lVar11 = dUdt_in->nstride;
      lVar53 = (long)(bx->smallend).vect[1];
      lVar48 = (long)(bx->smallend).vect[2];
      iVar1 = (bx->smallend).vect[0];
      pdVar38 = dUdt_out->p +
                (((long)iVar1 +
                 (lVar48 - (dUdt_out->begin).z) * lVar9 + (lVar53 - (dUdt_out->begin).y) * lVar8) -
                (long)(dUdt_out->begin).x);
      iVar2 = (bx->bigend).vect[0];
      iVar3 = (bx->bigend).vect[1];
      iVar4 = (bx->bigend).vect[2];
      pdVar23 = dUdt_in->p +
                (((long)iVar1 +
                 (lVar48 - (dUdt_in->begin).z) * lVar10 + (lVar53 - (dUdt_in->begin).y) * lVar22) -
                (long)(dUdt_in->begin).x);
      for (uVar41 = 0; pdVar27 = pdVar38, pdVar25 = pdVar23, lVar43 = lVar48, uVar41 != uVar37;
          uVar41 = uVar41 + 1) {
        for (; pdVar31 = pdVar27, lVar40 = lVar53, pdVar45 = pdVar25, lVar43 <= iVar4;
            lVar43 = lVar43 + 1) {
          for (; lVar40 <= iVar3; lVar40 = lVar40 + 1) {
            if (iVar1 <= iVar2) {
              lVar36 = 0;
              do {
                pdVar31[lVar36] = pdVar45[lVar36];
                lVar36 = lVar36 + 1;
              } while ((iVar2 - iVar1) + 1 != (int)lVar36);
            }
            pdVar31 = pdVar31 + lVar8;
            pdVar45 = pdVar45 + lVar22;
          }
          pdVar27 = pdVar27 + lVar9;
          pdVar25 = pdVar25 + lVar10;
        }
        pdVar38 = pdVar38 + lVar30;
        pdVar23 = pdVar23 + lVar11;
      }
    }
  }
  return;
}

Assistant:

void Redistribution::Apply ( Box const& bx, int ncomp,
                             Array4<Real      > const& dUdt_out,
                             Array4<Real      > const& dUdt_in,
                             Array4<Real const> const& U_in,
                             Array4<Real> const& scratch,
                             Array4<EBCellFlag const> const& flag,
                             AMREX_D_DECL(Array4<Real const> const& apx,
                                          Array4<Real const> const& apy,
                                          Array4<Real const> const& apz),
                             Array4<amrex::Real const> const& vfrac,
                             AMREX_D_DECL(Array4<Real const> const& fcx,
                                          Array4<Real const> const& fcy,
                                          Array4<Real const> const& fcz),
                             Array4<Real const> const& ccc,
                             amrex::BCRec  const* d_bcrec_ptr,
                             Geometry const& lev_geom, Real dt,
                             std::string redistribution_type,
                             const int srd_max_order,
                             amrex::Real target_volfrac,
                             Array4<Real const> const& srd_update_scale)
{
    // redistribution_type = "NoRedist";       // no redistribution
    // redistribution_type = "FluxRedist"      // flux_redistribute
    // redistribution_type = "StateRedist";    // (weighted) state redistribute

    amrex::ParallelFor(bx,ncomp,
    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            dUdt_out(i,j,k,n) = 0.;
        });

    if (redistribution_type == "FluxRedist")
    {
        int icomp = 0;
        apply_flux_redistribution (bx, dUdt_out, dUdt_in, scratch, icomp, ncomp, flag, vfrac, lev_geom);

    } else if (redistribution_type == "StateRedist") {

        Box const& bxg1 = grow(bx,1);
        Box const& bxg2 = grow(bx,2);
        Box const& bxg3 = grow(bx,3);
        Box const& bxg4 = grow(bx,4);

#if (AMREX_SPACEDIM == 2)
        // We assume that in 2D a cell will only need at most 3 neighbors to merge with, and we
        //    use the first component of this for the number of neighbors
        IArrayBox itracker(bxg4,4);
        // How many nbhds is a cell in
#else
        // We assume that in 3D a cell will only need at most 7 neighbors to merge with, and we
        //    use the first component of this for the number of neighbors
        IArrayBox itracker(bxg4,8);
#endif
        FArrayBox nrs_fab(bxg3,1);
        FArrayBox alpha_fab(bxg3,2);

        // Total volume of all cells in my nbhd
        FArrayBox nbhd_vol_fab(bxg2,1);

        // Centroid of my nbhd
        FArrayBox cent_hat_fab     (bxg3,AMREX_SPACEDIM);

        Elixir eli_itr = itracker.elixir();
        Array4<int> itr = itracker.array();
        Array4<int const> itr_const = itracker.const_array();

        Elixir eli_nrs = nrs_fab.elixir();
        Array4<Real      > nrs       = nrs_fab.array();
        Array4<Real const> nrs_const = nrs_fab.const_array();

        Elixir eli_alpha = alpha_fab.elixir();
        Array4<Real      > alpha       = alpha_fab.array();
        Array4<Real const> alpha_const = alpha_fab.const_array();

        Elixir eli_nbf = nbhd_vol_fab.elixir();
        Array4<Real      > nbhd_vol       = nbhd_vol_fab.array();
        Array4<Real const> nbhd_vol_const = nbhd_vol_fab.const_array();

        Elixir eli_chf = cent_hat_fab.elixir();
        Array4<Real      > cent_hat       = cent_hat_fab.array();
        Array4<Real const> cent_hat_const = cent_hat_fab.const_array();

        Box domain_per_grown = lev_geom.Domain();
        AMREX_D_TERM(if (lev_geom.isPeriodic(0)) domain_per_grown.grow(0,1);,
                     if (lev_geom.isPeriodic(1)) domain_per_grown.grow(1,1);,
                     if (lev_geom.isPeriodic(2)) domain_per_grown.grow(2,1););

        // At any external Dirichlet domain boundaries we need to set dUdt_in to 0
        //    in the cells just outside the domain because those values will be used
        //    in the slope computation in state redistribution.  We assume here that
        //    the ext_dir values of U_in itself have already been set.
        if (!domain_per_grown.contains(bxg1))
            amrex::ParallelFor(bxg1,ncomp,
            [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                {
                    if (!domain_per_grown.contains(IntVect(AMREX_D_DECL(i,j,k))))
                        dUdt_in(i,j,k,n) = 0.;
                });

        amrex::ParallelFor(Box(scratch), ncomp,
        [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            {
                const Real scale = (srd_update_scale) ? srd_update_scale(i,j,k) : Real(1.0);
                scratch(i,j,k,n) = U_in(i,j,k,n) + dt * dUdt_in(i,j,k,n) / scale;
            }
        );

        MakeITracker(bx, AMREX_D_DECL(apx, apy, apz), vfrac, itr, lev_geom, target_volfrac);

        MakeStateRedistUtils(bx, flag, vfrac, ccc, itr, nrs, alpha, nbhd_vol, cent_hat,
                             lev_geom, target_volfrac);

        StateRedistribute(bx, ncomp, dUdt_out, scratch, flag, vfrac,
                          AMREX_D_DECL(fcx, fcy, fcz), ccc,  d_bcrec_ptr,
                          itr_const, nrs_const, alpha_const, nbhd_vol_const,
                          cent_hat_const, lev_geom, srd_max_order);

        amrex::ParallelFor(bx, ncomp,
        [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            {
                // Only update the values which actually changed -- this makes
                // the results insensitive to tiling -- otherwise cells that aren't
                // changed but are in a tile on which StateRedistribute gets called
                // will have precision-level changes due to adding/subtracting U_in
                // and multiplying/dividing by dt.   Here we test on whether (i,j,k)
                // has at least one neighbor and/or whether (i,j,k) is in the
                // neighborhood of another cell -- if either of those is true the
                // value may have changed

                if (itr(i,j,k,0) > 0 || nrs(i,j,k) > 1.)
                {
                   const Real scale = (srd_update_scale) ? srd_update_scale(i,j,k) : Real(1.0);

                   dUdt_out(i,j,k,n) = scale * (dUdt_out(i,j,k,n) - U_in(i,j,k,n)) / dt;

                }
                else
                {
                   dUdt_out(i,j,k,n) = dUdt_in(i,j,k,n);
                }
            }
        );

    } else if (redistribution_type == "NoRedist") {
        amrex::ParallelFor(bx, ncomp,
        [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            {
                dUdt_out(i,j,k,n) = dUdt_in(i,j,k,n);
            }
        );

    } else {
       amrex::Error("Not a legit redist_type");
    }
}